

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

BigInteger * __thiscall
Algorithms::pollardRho(BigInteger *__return_storage_ptr__,Algorithms *this,BigInteger *n)

{
  bool bVar1;
  int iVar2;
  bool local_37b;
  bool local_379;
  BigInteger local_358;
  BigInteger local_338;
  BigInteger local_318;
  BigInteger local_2f8;
  BigInteger local_2d8;
  BigInteger local_2b8;
  BigInteger local_298;
  BigInteger local_278;
  BigInteger local_258;
  BigInteger local_238;
  BigInteger local_218;
  BigInteger local_1f8;
  BigInteger local_1d8;
  byte local_1b1;
  BigInteger local_1b0;
  int local_18c;
  undefined1 local_188 [4];
  int i;
  BigInteger local_168;
  BigInteger local_148;
  undefined1 local_121;
  BigInteger local_120;
  BigInteger local_100;
  BigInteger local_e0;
  int local_bc;
  undefined1 local_b8 [4];
  int q;
  BigInteger b1;
  BigInteger local_88;
  BigInteger local_68;
  undefined1 local_48 [8];
  BigInteger b0;
  int iterations_count;
  BigInteger *n_local;
  Algorithms *this_local;
  BigInteger *g;
  
  b0._28_4_ = 100000;
  BigIntegerLibrary::BigInteger::BigInteger(&local_68,0);
  BigIntegerLibrary::BigInteger::operator-(&local_88,n,1);
  random((Algorithms *)local_48);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_88);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_68);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_b8,(BigInteger *)local_48);
  iVar2 = rand();
  local_bc = iVar2 + 1 + (iVar2 / 5) * -5;
  BigIntegerLibrary::BigInteger::operator*(&local_120,(BigInteger *)local_b8,(BigInteger *)local_b8)
  ;
  BigIntegerLibrary::BigInteger::operator+(&local_100,&local_120,(long)local_bc);
  BigIntegerLibrary::BigInteger::operator%(&local_e0,&local_100,n);
  BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_b8,&local_e0);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_e0);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_100);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_120);
  local_121 = 0;
  BigIntegerLibrary::BigInteger::operator-(&local_168,(BigInteger *)local_b8,(BigInteger *)local_48)
  ;
  BigIntegerLibrary::abs((BigIntegerLibrary *)&local_148,(int)&local_168);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_188,n);
  BigIntegerLibrary::gcd(__return_storage_ptr__,&local_148,(BigInteger *)local_188);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_188);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_148);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_168);
  local_18c = 0;
  while( true ) {
    local_1b1 = 0;
    local_379 = false;
    if (local_18c < 100000) {
      BigIntegerLibrary::BigInteger::BigInteger(&local_1b0,1);
      local_1b1 = 1;
      bVar1 = BigIntegerLibrary::BigInteger::operator==(__return_storage_ptr__,&local_1b0);
      local_37b = true;
      if (!bVar1) {
        local_37b = BigIntegerLibrary::BigInteger::operator==(__return_storage_ptr__,n);
      }
      local_379 = local_37b;
    }
    if ((local_1b1 & 1) != 0) {
      BigIntegerLibrary::BigInteger::~BigInteger(&local_1b0);
    }
    if (local_379 == false) break;
    BigIntegerLibrary::BigInteger::operator*
              (&local_218,(BigInteger *)local_48,(BigInteger *)local_48);
    BigIntegerLibrary::BigInteger::operator+(&local_1f8,&local_218,(long)local_bc);
    BigIntegerLibrary::BigInteger::operator%(&local_1d8,&local_1f8,n);
    BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_48,&local_1d8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1d8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1f8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_218);
    BigIntegerLibrary::BigInteger::operator*
              (&local_278,(BigInteger *)local_b8,(BigInteger *)local_b8);
    BigIntegerLibrary::BigInteger::operator+(&local_258,&local_278,(long)local_bc);
    BigIntegerLibrary::BigInteger::operator%(&local_238,&local_258,n);
    BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_b8,&local_238);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_238);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_258);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_278);
    BigIntegerLibrary::BigInteger::operator*
              (&local_2d8,(BigInteger *)local_b8,(BigInteger *)local_b8);
    BigIntegerLibrary::BigInteger::operator+(&local_2b8,&local_2d8,(long)local_bc);
    BigIntegerLibrary::BigInteger::operator%(&local_298,&local_2b8,n);
    BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_b8,&local_298);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_298);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2b8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2d8);
    BigIntegerLibrary::BigInteger::operator-
              (&local_338,(BigInteger *)local_b8,(BigInteger *)local_48);
    BigIntegerLibrary::abs((BigIntegerLibrary *)&local_318,(int)&local_338);
    BigIntegerLibrary::BigInteger::BigInteger(&local_358,n);
    BigIntegerLibrary::gcd(&local_2f8,&local_318,&local_358);
    BigIntegerLibrary::BigInteger::operator=(__return_storage_ptr__,&local_2f8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2f8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_358);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_318);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_338);
    local_18c = local_18c + 1;
  }
  local_121 = 1;
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_b8);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_48);
  return __return_storage_ptr__;
}

Assistant:

BigInteger Algorithms::pollardRho(BigInteger n) {
    const int iterations_count = 1e5;
    BigInteger b0 = random(0, n - 1);
    BigInteger b1 = b0;
    int q = rand() % 5 + 1;
    b1 = (b1 * b1 + q) % n;
    BigInteger g = gcd(abs(b1 - b0), n);
    for (int i = 0; i < iterations_count && (g == 1 || g == n); ++i) {
        b0 = (b0 * b0 + q) % n;
        b1 = (b1 * b1 + q) % n;
        b1 = (b1 * b1 + q) % n;
        g = gcd(abs(b1 - b0), n);
    }
    return g;
}